

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::~ListCoinsTestingSetup(ListCoinsTestingSetup *this)

{
  long lVar1;
  array<unsigned_char,_32UL> *t;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::reset
            ((__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &this->wallet,(pointer)0x0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            (&this->wallet);
  t = (this->super_TestChain100Setup).coinbaseKey.keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (t != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
               &(this->super_TestChain100Setup).coinbaseKey.keydata,t);
  }
  (this->super_TestChain100Setup).coinbaseKey.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&(this->super_TestChain100Setup).m_coinbase_txns);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~ListCoinsTestingSetup()
    {
        wallet.reset();
    }